

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_mktime_tzname.c
# Opt level: O2

time_t time1(tm *tmp,_func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *funcp,state *sp,
            int_fast32_t offset)

{
  byte bVar1;
  byte bVar2;
  time_t tVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  byte *pbVar8;
  ulong uVar9;
  bool bVar10;
  _Bool okay;
  int_fast32_t local_264;
  _func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *local_260;
  ulong local_258;
  ulong local_250;
  ulong local_248;
  state *local_240;
  uchar types [256];
  char seen [256];
  
  local_264 = offset;
  local_260 = funcp;
  if (tmp == (tm *)0x0) {
    piVar4 = _PDCLIB_errno_func();
    *piVar4 = 0x16;
    tVar3 = -1;
  }
  else {
    if (1 < tmp->tm_isdst) {
      tmp->tm_isdst = 1;
    }
    tVar3 = time2(tmp,funcp,sp,offset,&okay);
    if (((okay == false) && (uVar7 = tmp->tm_isdst, -1 < (int)uVar7)) &&
       (tVar3 = -1, sp != (state *)0x0)) {
      uVar6 = 0;
      uVar5 = (ulong)(uint)sp->typecnt;
      if (sp->typecnt < 1) {
        uVar5 = uVar6;
      }
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        seen[uVar6] = '\0';
      }
      uVar5 = (ulong)(uint)sp->timecnt;
      local_250 = 0;
      while (uVar6 = local_250 & 0xffffffff, 0 < (int)uVar5) {
        bVar1 = sp->types[uVar5 - 1];
        uVar5 = uVar5 - 1;
        if (seen[bVar1] == '\0') {
          seen[bVar1] = '\x01';
          local_250 = local_250 + 1;
          types[uVar6] = bVar1;
        }
      }
      uVar5 = local_250;
      local_258 = uVar6;
      local_240 = sp;
      for (local_248 = 0; tVar3 = -1, local_248 != uVar6; local_248 = local_248 + 1) {
        bVar1 = types[local_248];
        uVar9 = uVar5;
        if (uVar7 == sp->ttis[bVar1].isdst) {
          pbVar8 = types;
          while (bVar10 = uVar5 != 0, uVar5 = uVar5 - 1, uVar6 = local_258, uVar9 = local_250,
                bVar10) {
            bVar2 = *pbVar8;
            if (uVar7 != sp->ttis[bVar2].isdst) {
              tmp->tm_sec = tmp->tm_sec + (sp->ttis[bVar2].utoff - sp->ttis[bVar1].utoff);
              tmp->tm_isdst = (uint)(uVar7 == 0);
              tVar3 = time2(tmp,local_260,local_240,local_264,&okay);
              if (okay != false) {
                return tVar3;
              }
              tmp->tm_sec = tmp->tm_sec + (sp->ttis[bVar1].utoff - sp->ttis[bVar2].utoff);
              bVar10 = tmp->tm_isdst == 0;
              uVar7 = (uint)bVar10;
              tmp->tm_isdst = (uint)bVar10;
            }
            pbVar8 = pbVar8 + 1;
          }
        }
        uVar5 = uVar9;
      }
    }
  }
  return tVar3;
}

Assistant:

static time_t time1( struct tm * tmp, struct tm *(*funcp)( struct state const *, time_t const *, int_fast32_t, struct tm * ), struct state const * sp, const int_fast32_t offset )
{
    time_t        t;
    int           samei, otheri;
    int           sameind, otherind;
    int           i;
    int           nseen;
    char          seen[TZ_MAX_TYPES];
    unsigned char types[TZ_MAX_TYPES];
    bool          okay;

    if ( tmp == NULL )
    {
        *_PDCLIB_errno_func() = _PDCLIB_EINVAL;
        return WRONG;
    }

    if ( tmp->tm_isdst > 1 )
    {
        tmp->tm_isdst = 1;
    }

    t = time2( tmp, funcp, sp, offset, &okay );

    if ( okay )
    {
        return t;
    }

    if ( tmp->tm_isdst < 0 )
    {
#ifdef PCTS
        /* POSIX Conformance Test Suite code courtesy Grant Sullivan. */
        tmp->tm_isdst = 0;  /* reset to std and try again */
#else
        return t;
#endif
    }

    /* We're supposed to assume that somebody took a time of one type
       and did some math on it that yielded a "struct tm" that's bad.
       We try to divine the type they started from and adjust to the
       type they need.
    */
    if ( sp == NULL )
    {
        return WRONG;
    }

    for ( i = 0; i < sp->typecnt; ++i )
    {
        seen[ i ] = false;
    }

    nseen = 0;

    for ( i = sp->timecnt - 1; i >= 0; --i )
    {
        if ( ! seen[ sp->types[ i ] ] )
        {
            seen[ sp->types[ i ] ] = true;
            types[ nseen++ ] = sp->types[ i ];
        }
    }

    for ( sameind = 0; sameind < nseen; ++sameind )
    {
        samei = types[ sameind ];

        if ( sp->ttis[ samei ].isdst != tmp->tm_isdst )
        {
            continue;
        }

        for ( otherind = 0; otherind < nseen; ++otherind )
        {
            otheri = types[ otherind ];

            if ( sp->ttis[ otheri ].isdst == tmp->tm_isdst )
            {
                continue;
            }

            tmp->tm_sec += ( sp->ttis[ otheri ].utoff - sp->ttis[ samei ].utoff );
            tmp->tm_isdst = ! tmp->tm_isdst;
            t = time2( tmp, funcp, sp, offset, &okay );

            if ( okay )
            {
                return t;
            }

            tmp->tm_sec -= ( sp->ttis[ otheri ].utoff - sp->ttis[ samei ].utoff );
            tmp->tm_isdst = ! tmp->tm_isdst;
        }
    }

    return WRONG;
}